

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O2

void linenoiseEditStop(linenoiseState *l)

{
  int iVar1;
  
  iVar1 = isatty(l->ifd);
  if (iVar1 != 0) {
    disableRawMode(l->ifd);
    putchar(10);
    return;
  }
  return;
}

Assistant:

void linenoiseEditStop(struct linenoiseState *l) {
    if (!isatty(l->ifd)) return;
    disableRawMode(l->ifd);
    printf("\n");
}